

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin2.c
# Opt level: O1

int Gia_ManAnnotateUnrolling(Gia_Man_t *p,Abc_Cex_t *pCex,int fJustMax)

{
  uint *puVar1;
  undefined1 *puVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  Vec_Int_t *pVVar10;
  int *piVar11;
  Gia_Obj_t *pGVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  ulong *puVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  Gia_Obj_t *pGVar28;
  long lVar29;
  Gia_Obj_t *pGVar30;
  Gia_Obj_t *pGVar31;
  
  if (p->vTruths != (Vec_Int_t *)0x0) {
    __assert_fail("p->vTruths == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                  ,0x4d,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  iVar13 = ((p->nObjs >> 4) + 1) - (uint)((p->nObjs & 0xfU) == 0);
  p->nTtWords = iVar13;
  lVar29 = (long)iVar13 * ((long)pCex->iFrame + 1);
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  iVar13 = (int)lVar29;
  iVar14 = 0x10;
  if (0xe < iVar13 - 1U) {
    iVar14 = iVar13;
  }
  pVVar10->nSize = 0;
  pVVar10->nCap = iVar14;
  if (iVar14 == 0) {
    piVar11 = (int *)0x0;
  }
  else {
    piVar11 = (int *)malloc((long)iVar14 << 2);
  }
  pVVar10->pArray = piVar11;
  pVVar10->nSize = iVar13;
  if (piVar11 != (int *)0x0) {
    memset(piVar11,0,lVar29 * 4);
  }
  p->vTruths = pVVar10;
  Gia_ManCleanMark0(p);
  iVar13 = pCex->nRegs;
  if (-1 < pCex->iFrame) {
    iVar14 = 0;
    do {
      pVVar10 = p->vCis;
      uVar23 = (ulong)(uint)pVVar10->nSize;
      if (p->nRegs < pVVar10->nSize) {
        lVar29 = 0;
        do {
          if ((int)uVar23 <= lVar29) goto LAB_0057a0c1;
          iVar27 = pVVar10->pArray[lVar29];
          if (((long)iVar27 < 0) || (p->nObjs <= iVar27)) goto LAB_0057a064;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          uVar25 = iVar13 + (int)lVar29;
          pGVar5 = p->pObjs + iVar27;
          uVar26 = (&pCex[1].iPo)[(int)uVar25 >> 5];
          *(ulong *)pGVar5 =
               *(ulong *)pGVar5 & 0xffffffffbfffffff |
               (ulong)((uint)((uVar26 >> (uVar25 & 0x1f) & 1) != 0) << 0x1e);
          if ((uVar26 >> (uVar25 & 0x1f) & 1) != 0) {
            pGVar31 = p->pObjs;
            if ((pGVar5 < pGVar31) || (pGVar31 + p->nObjs <= pGVar5)) goto LAB_0057a083;
            uVar26 = p->nTtWords * iVar14;
            if (((int)uVar26 < 0) || (p->vTruths->nSize <= (int)uVar26)) goto LAB_0057a0a2;
            iVar27 = (int)((ulong)((long)pGVar5 - (long)pGVar31) >> 2) * -0x55555555;
            puVar1 = (uint *)(p->vTruths->pArray + (ulong)uVar26 + (long)(iVar27 >> 4));
            *puVar1 = *puVar1 | 1 << ((char)iVar27 * '\x02' & 0x1fU);
          }
          lVar29 = lVar29 + 1;
          pVVar10 = p->vCis;
          uVar23 = (ulong)pVVar10->nSize;
        } while (lVar29 < (long)(uVar23 - (long)p->nRegs));
        iVar13 = iVar13 + (int)lVar29;
      }
      if (0 < p->nObjs) {
        lVar29 = 0;
        lVar22 = 0;
        do {
          pGVar5 = p->pObjs;
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          pGVar31 = (Gia_Obj_t *)(&pGVar5->field_0x0 + lVar29);
          uVar23 = *(ulong *)pGVar31;
          if (((uVar23 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar23) &&
             (uVar26 = ((uint)(uVar23 >> 0x3d) ^
                       *(uint *)((long)pGVar31 + (ulong)((uint)(uVar23 >> 0x1e) & 0x7ffffffc) * -3)
                       >> 0x1e) &
                       ((uint)(uVar23 >> 0x1d) & 7 ^
                       *(uint *)((long)pGVar31 + (ulong)(uint)((int)(uVar23 & 0x1fffffff) << 2) * -3
                                ) >> 0x1e) & 1,
             *(ulong *)(&pGVar5->field_0x0 + lVar29) =
                  uVar23 & 0xffffffff3fffffff | (ulong)(uVar26 << 0x1e), uVar26 != 0)) {
            pGVar6 = p->pObjs;
            if ((pGVar31 < pGVar6) || (pGVar6 + p->nObjs <= pGVar31)) goto LAB_0057a083;
            uVar26 = p->nTtWords * iVar14;
            if (((int)uVar26 < 0) || (p->vTruths->nSize <= (int)uVar26)) goto LAB_0057a0a2;
            iVar27 = (int)((ulong)((long)pGVar5 + (lVar29 - (long)pGVar6)) >> 2) * -0x55555555;
            puVar1 = (uint *)(p->vTruths->pArray + (ulong)uVar26 + (long)(iVar27 >> 4));
            *puVar1 = *puVar1 | 1 << ((char)iVar27 * '\x02' & 0x1fU);
          }
          lVar22 = lVar22 + 1;
          lVar29 = lVar29 + 0xc;
        } while (lVar22 < p->nObjs);
      }
      pVVar10 = p->vCos;
      if (0 < pVVar10->nSize) {
        lVar29 = 0;
        do {
          iVar27 = pVVar10->pArray[lVar29];
          if (((long)iVar27 < 0) || (p->nObjs <= iVar27)) goto LAB_0057a064;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar5 = p->pObjs + iVar27;
          uVar23 = *(ulong *)pGVar5;
          uVar25 = (uint)(uVar23 >> 0x1d) & 1;
          uVar26 = *(uint *)(pGVar5 + -(ulong)((uint)uVar23 & 0x1fffffff)) >> 0x1e & 1;
          *(ulong *)pGVar5 = uVar23 & 0xffffffffbfffffff | (ulong)((uVar26 ^ uVar25) << 0x1e);
          if (uVar26 != uVar25) {
            pGVar31 = p->pObjs;
            if ((pGVar5 < pGVar31) || (pGVar31 + p->nObjs <= pGVar5)) goto LAB_0057a083;
            uVar26 = p->nTtWords * iVar14;
            if (((int)uVar26 < 0) || (p->vTruths->nSize <= (int)uVar26)) goto LAB_0057a0a2;
            iVar27 = (int)((ulong)((long)pGVar5 - (long)pGVar31) >> 2) * -0x55555555;
            puVar1 = (uint *)(p->vTruths->pArray + (ulong)uVar26 + (long)(iVar27 >> 4));
            *puVar1 = *puVar1 | 1 << ((char)iVar27 * '\x02' & 0x1fU);
          }
          lVar29 = lVar29 + 1;
          pVVar10 = p->vCos;
        } while (lVar29 < pVVar10->nSize);
      }
      if (iVar14 == pCex->iFrame) break;
      iVar27 = p->nRegs;
      if (0 < iVar27) {
        iVar21 = 0;
        do {
          iVar3 = p->vCos->nSize;
          uVar26 = (iVar3 - iVar27) + iVar21;
          if (((int)uVar26 < 0) || (iVar3 <= (int)uVar26)) goto LAB_0057a0c1;
          iVar3 = p->vCos->pArray[uVar26];
          if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_0057a064;
          pGVar5 = p->pObjs;
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          iVar4 = p->vCis->nSize;
          uVar26 = (iVar4 - iVar27) + iVar21;
          if (((int)uVar26 < 0) || (iVar4 <= (int)uVar26)) goto LAB_0057a0c1;
          iVar27 = p->vCis->pArray[uVar26];
          lVar29 = (long)iVar27;
          if ((lVar29 < 0) || (p->nObjs <= iVar27)) goto LAB_0057a064;
          uVar26 = *(uint *)(pGVar5 + iVar3) >> 0x1e & 1;
          *(ulong *)(pGVar5 + lVar29) =
               *(ulong *)(pGVar5 + lVar29) & 0xffffffffbfffffff | (ulong)(uVar26 << 0x1e);
          if (uVar26 != 0) {
            pGVar5 = pGVar5 + lVar29;
            pGVar31 = p->pObjs;
            if ((pGVar5 < pGVar31) || (pGVar31 + p->nObjs <= pGVar5)) goto LAB_0057a083;
            uVar26 = p->nTtWords * (iVar14 + 1);
            if (((int)uVar26 < 0) || (p->vTruths->nSize <= (int)uVar26)) goto LAB_0057a0a2;
            iVar27 = (int)((ulong)((long)pGVar5 - (long)pGVar31) >> 2) * -0x55555555;
            puVar1 = (uint *)(p->vTruths->pArray + (ulong)uVar26 + (long)(iVar27 >> 4));
            *puVar1 = *puVar1 | 1 << ((char)iVar27 * '\x02' & 0x1fU);
          }
          iVar21 = iVar21 + 1;
          iVar27 = p->nRegs;
        } while (iVar21 < iVar27);
      }
      bVar7 = iVar14 < pCex->iFrame;
      iVar14 = iVar14 + 1;
    } while (bVar7);
  }
  if (iVar13 != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                  ,99,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  uVar26 = pCex->iPo;
  iVar13 = p->vCos->nSize;
  if (iVar13 - p->nRegs <= (int)uVar26) {
LAB_0057a15c:
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (((int)uVar26 < 0) || (iVar13 <= (int)uVar26)) {
LAB_0057a0c1:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar13 = p->vCos->pArray[uVar26];
  if ((-1 < (long)iVar13) && (iVar13 < p->nObjs)) {
    uVar26 = *(uint *)(p->pObjs + iVar13);
    if ((uVar26 >> 0x1e & 1) == 0) {
      puts("Counter-example is invalid.");
    }
    Gia_ManCleanMark0(p);
    uVar25 = pCex->iPo;
    iVar13 = p->vCos->nSize;
    if (iVar13 - p->nRegs <= (int)uVar25) goto LAB_0057a15c;
    if (((int)uVar25 < 0) || (iVar13 <= (int)uVar25)) goto LAB_0057a0c1;
    iVar13 = p->vCos->pArray[uVar25];
    if ((-1 < (long)iVar13) && (iVar13 < p->nObjs)) {
      pGVar5 = p->pObjs + iVar13;
      *(ulong *)pGVar5 = *(ulong *)pGVar5 | 0x40000000;
      pGVar31 = p->pObjs;
      if ((pGVar5 < pGVar31) || (pGVar31 + p->nObjs <= pGVar5)) {
LAB_0057a083:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar25 = pCex->iFrame * p->nTtWords;
      if (((int)uVar25 < 0) || (p->vTruths->nSize <= (int)uVar25)) {
LAB_0057a0a2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      iVar13 = (int)((ulong)((long)pGVar5 - (long)pGVar31) >> 2) * -0x55555555;
      puVar1 = (uint *)(p->vTruths->pArray + (ulong)uVar25 + (long)(iVar13 >> 4));
      *puVar1 = *puVar1 | 2 << ((char)iVar13 * '\x02' & 0x1fU);
      iVar13 = pCex->iFrame;
      if (pCex->iFrame < 0) {
LAB_0057a041:
        Gia_ManCleanMark0(p);
        return uVar26 >> 0x1e & 1;
      }
      do {
        iVar14 = iVar13;
        pVVar10 = p->vCos;
        if (0 < pVVar10->nSize) {
          lVar29 = 0;
          do {
            iVar13 = pVVar10->pArray[lVar29];
            if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_0057a064;
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            pGVar5 = p->pObjs + iVar13;
            uVar23 = *(ulong *)pGVar5 >> 0x1e;
            uVar16 = (ulong)((uint)*(ulong *)pGVar5 & 0x1fffffff);
            *(ulong *)(pGVar5 + -uVar16) =
                 *(ulong *)(pGVar5 + -uVar16) & 0xffffffffbfffffff |
                 (ulong)(((uint)uVar23 & 1) << 0x1e);
            if ((uVar23 & 1) != 0) {
              uVar23 = *(ulong *)pGVar5;
              *(ulong *)pGVar5 = uVar23 & 0xffffffffbfffffff;
              pGVar5 = pGVar5 + -(ulong)((uint)uVar23 & 0x1fffffff);
              pGVar31 = p->pObjs;
              if ((pGVar5 < pGVar31) || (pGVar31 + p->nObjs <= pGVar5)) goto LAB_0057a083;
              uVar25 = p->nTtWords * iVar14;
              if (((int)uVar25 < 0) || (p->vTruths->nSize <= (int)uVar25)) goto LAB_0057a0a2;
              iVar13 = (int)((ulong)((long)pGVar5 - (long)pGVar31) >> 2) * -0x55555555;
              puVar1 = (uint *)(p->vTruths->pArray + (ulong)uVar25 + (long)(iVar13 >> 4));
              *puVar1 = *puVar1 | 2 << ((char)iVar13 * '\x02' & 0x1fU);
            }
            lVar29 = lVar29 + 1;
            pVVar10 = p->vCos;
          } while (lVar29 < pVVar10->nSize);
        }
        lVar29 = (long)p->nObjs;
        if (1 < lVar29) {
          lVar22 = lVar29 * 0xc;
          do {
            lVar24 = lVar22 + -0xc;
            if (p->nObjs < lVar29) goto LAB_0057a064;
            pGVar5 = p->pObjs;
            if (pGVar5 == (Gia_Obj_t *)0x0) break;
            lVar18 = lVar29 + -1;
            pGVar31 = (Gia_Obj_t *)(&pGVar5[-1].field_0x0 + lVar22);
            uVar23 = *(ulong *)pGVar31;
            uVar25 = (uint)uVar23;
            if ((uVar25 & 0xc0000000) == 0x40000000 && (~uVar25 & 0x1fffffff) != 0) {
              *(ulong *)pGVar31 = uVar23 & 0xffffffff3fffffff;
              pGVar6 = p->pObjs;
              if ((pGVar31 < pGVar6) || (pGVar12 = pGVar6 + p->nObjs, pGVar12 <= pGVar31))
              goto LAB_0057a083;
              uVar8 = p->nTtWords * iVar14;
              if (((int)uVar8 < 0) || (p->vTruths->nSize <= (int)uVar8)) goto LAB_0057a0a2;
              iVar13 = (int)((ulong)((long)pGVar5 + (lVar24 - (long)pGVar6)) >> 2);
              piVar11 = p->vTruths->pArray;
              pGVar28 = (Gia_Obj_t *)
                        ((long)pGVar5 + lVar24 + (ulong)((uVar25 & 0x1fffffff) * 4) * -3);
              if ((pGVar28 < pGVar6) || (pGVar12 <= pGVar28)) goto LAB_0057a083;
              iVar27 = (int)((long)pGVar5 +
                             lVar24 + ((ulong)((uVar25 & 0x1fffffff) << 2) * -3 - (long)pGVar6) >> 2
                            );
              uVar25 = (uint)(uVar23 >> 0x20);
              uVar15 = uVar25 & 0x1fffffff;
              pGVar30 = (Gia_Obj_t *)((long)pGVar5 + lVar24 + (ulong)(uVar15 * 4) * -3);
              if ((pGVar30 < pGVar6) || (pGVar12 <= pGVar30)) goto LAB_0057a083;
              uVar19 = (uint)(uVar23 >> 0x1d) & 1;
              uVar9 = (uint)(((uint)piVar11[(ulong)uVar8 + (long)(iVar27 * -0x55555555 >> 4)] >>
                              (iVar27 * 0x55555556 & 0x1fU) & 1) != 0);
              iVar27 = (int)((long)pGVar5 + lVar24 + ((ulong)(uVar15 << 2) * -3 - (long)pGVar6) >> 2
                            );
              uVar20 = uVar25 >> 0x1d & 1;
              uVar25 = (uint)(((uint)piVar11[(ulong)uVar8 + (long)(iVar27 * -0x55555555 >> 4)] >>
                               (iVar27 * 0x55555556 & 0x1fU) & 1) != 0);
              uVar15 = uVar25 ^ uVar20;
              uVar8 = (uint)(((uint)piVar11[(ulong)uVar8 + (long)(iVar13 * -0x55555555 >> 4)] >>
                              (iVar13 * 0x55555556 & 0x1fU) & 1) != 0);
              if ((uVar9 ^ uVar19) == uVar15) {
                if (uVar8 != uVar15) {
                  __assert_fail("Value == (Value0 & Value1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                                ,0x81,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)")
                  ;
                }
                if (uVar8 == 0 && fJustMax == 0) {
LAB_00579d3b:
                  pGVar28->field_0x3 = pGVar28->field_0x3 | 0x40;
                  uVar25 = (uint)*(undefined8 *)(&pGVar5[-1].field_0x0 + lVar22) & 0x1fffffff;
                  pGVar31 = (Gia_Obj_t *)((long)pGVar31 + (ulong)(uVar25 * 4) * -3);
                  pGVar6 = p->pObjs;
                  if ((pGVar6 <= pGVar31) && (pGVar31 < pGVar6 + p->nObjs)) {
                    uVar8 = p->nTtWords * iVar14;
                    if ((-1 < (int)uVar8) && (pVVar10 = p->vTruths, (int)uVar8 < pVVar10->nSize)) {
                      lVar22 = ((ulong)uVar25 * -0xc + lVar18 * 0xc) - (long)pGVar6;
                      goto LAB_00579e46;
                    }
                    goto LAB_0057a0a2;
                  }
                  goto LAB_0057a083;
                }
                pGVar30->field_0x3 = pGVar30->field_0x3 | 0x40;
                puVar17 = (ulong *)((long)pGVar31 +
                                   (ulong)((*(uint *)(&pGVar5[-1].field_0x0 + lVar22) & 0x1fffffff)
                                          << 2) * -3);
                *puVar17 = *puVar17 | 0x40000000;
                uVar25 = (uint)*(undefined8 *)(&pGVar5[-1].field_0x0 + lVar22) & 0x1fffffff;
                pGVar12 = (Gia_Obj_t *)((long)pGVar31 + (ulong)(uVar25 * 4) * -3);
                pGVar6 = p->pObjs;
                if ((pGVar12 < pGVar6) || (pGVar6 + p->nObjs <= pGVar12)) goto LAB_0057a083;
                uVar8 = p->nTtWords * iVar14;
                if (((int)uVar8 < 0) || (pVVar10 = p->vTruths, pVVar10->nSize <= (int)uVar8))
                goto LAB_0057a0a2;
                iVar13 = (int)((long)pGVar5 + lVar24 + ((ulong)(uVar25 << 2) * -3 - (long)pGVar6) >>
                              2) * -0x55555555;
                piVar11 = pVVar10->pArray;
                piVar11[(ulong)uVar8 + (long)(iVar13 >> 4)] =
                     piVar11[(ulong)uVar8 + (long)(iVar13 >> 4)] |
                     2 << ((char)iVar13 * '\x02' & 0x1fU);
                uVar25 = *(uint *)(&pGVar5[-1].field_0x4 + lVar22) & 0x1fffffff;
                pGVar31 = (Gia_Obj_t *)((long)pGVar31 + (ulong)(uVar25 * 4) * -3);
                if ((pGVar31 < pGVar6) || (pGVar6 + p->nObjs <= pGVar31)) goto LAB_0057a083;
                uVar8 = p->nTtWords * iVar14;
                if (((int)uVar8 < 0) || (pVVar10->nSize <= (int)uVar8)) goto LAB_0057a0a2;
                lVar22 = ((ulong)uVar25 * -0xc + lVar18 * 0xc) - (long)pGVar6;
              }
              else {
                if (uVar9 == uVar19) {
                  if (uVar8 != 0) {
                    __assert_fail("Value == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                                  ,0x90,
                                  "int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)");
                  }
                  goto LAB_00579d3b;
                }
                if (uVar25 != uVar20) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                                ,0x9a,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)")
                  ;
                }
                if (uVar8 != 0) {
                  __assert_fail("Value == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                                ,0x96,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)")
                  ;
                }
                pGVar30->field_0x3 = pGVar30->field_0x3 | 0x40;
                uVar25 = *(uint *)(&pGVar5[-1].field_0x4 + lVar22) & 0x1fffffff;
                pGVar31 = (Gia_Obj_t *)((long)pGVar31 + (ulong)(uVar25 * 4) * -3);
                pGVar6 = p->pObjs;
                if ((pGVar31 < pGVar6) || (pGVar6 + p->nObjs <= pGVar31)) goto LAB_0057a083;
                uVar8 = p->nTtWords * iVar14;
                if (((int)uVar8 < 0) || (pVVar10 = p->vTruths, pVVar10->nSize <= (int)uVar8))
                goto LAB_0057a0a2;
                lVar22 = lVar24 + ((ulong)(uVar25 << 2) * -3 - (long)pGVar6);
LAB_00579e46:
                piVar11 = pVVar10->pArray;
              }
              iVar13 = (int)((ulong)(&pGVar5->field_0x0 + lVar22) >> 2) * -0x55555555;
              piVar11[(ulong)uVar8 + (long)(iVar13 >> 4)] =
                   piVar11[(ulong)uVar8 + (long)(iVar13 >> 4)] |
                   2 << ((char)iVar13 * '\x02' & 0x1fU);
            }
            bVar7 = 2 < lVar29;
            lVar29 = lVar18;
            lVar22 = lVar24;
          } while (bVar7);
        }
        iVar13 = iVar14 + -1;
        if (iVar14 == 0) goto LAB_0057a041;
        pVVar10 = p->vCis;
        uVar23 = (ulong)(uint)pVVar10->nSize;
        if (p->nRegs < pVVar10->nSize) {
          lVar29 = 0;
          do {
            if ((int)uVar23 <= lVar29) goto LAB_0057a0c1;
            iVar27 = pVVar10->pArray[lVar29];
            if (((long)iVar27 < 0) || (p->nObjs <= iVar27)) goto LAB_0057a064;
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            puVar2 = &p->pObjs[iVar27].field_0x3;
            *puVar2 = *puVar2 & 0xbf;
            lVar29 = lVar29 + 1;
            pVVar10 = p->vCis;
            uVar23 = (ulong)pVVar10->nSize;
          } while (lVar29 < (long)(uVar23 - (long)p->nRegs));
        }
        iVar27 = p->nRegs;
        if (0 < iVar27) {
          iVar21 = 0;
          do {
            iVar3 = p->vCos->nSize;
            uVar25 = (iVar3 - iVar27) + iVar21;
            if (((int)uVar25 < 0) || (iVar3 <= (int)uVar25)) goto LAB_0057a0c1;
            iVar3 = p->vCos->pArray[uVar25];
            if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_0057a064;
            pGVar31 = p->pObjs;
            pGVar5 = pGVar31 + iVar3;
            if (pGVar31 == (Gia_Obj_t *)0x0) break;
            iVar3 = p->vCis->nSize;
            uVar25 = (iVar3 - iVar27) + iVar21;
            if (((int)uVar25 < 0) || (iVar3 <= (int)uVar25)) goto LAB_0057a0c1;
            iVar27 = p->vCis->pArray[uVar25];
            lVar29 = (long)iVar27;
            if ((lVar29 < 0) || (p->nObjs <= iVar27)) goto LAB_0057a064;
            uVar25 = *(uint *)(pGVar31 + lVar29) >> 0x1e & 1;
            *(ulong *)pGVar5 = *(ulong *)pGVar5 & 0xffffffffbfffffff | (ulong)(uVar25 << 0x1e);
            if (uVar25 != 0) {
              pGVar31[lVar29].field_0x3 = pGVar31[lVar29].field_0x3 & 0xbf;
              pGVar31 = p->pObjs;
              if ((pGVar5 < pGVar31) || (pGVar31 + p->nObjs <= pGVar5)) goto LAB_0057a083;
              uVar25 = p->nTtWords * (iVar14 + -1);
              if (((int)uVar25 < 0) || (p->vTruths->nSize <= (int)uVar25)) goto LAB_0057a0a2;
              iVar27 = (int)((ulong)((long)pGVar5 - (long)pGVar31) >> 2) * -0x55555555;
              puVar1 = (uint *)(p->vTruths->pArray + (ulong)uVar25 + (long)(iVar27 >> 4));
              *puVar1 = *puVar1 | 2 << ((char)iVar27 * '\x02' & 0x1fU);
            }
            iVar21 = iVar21 + 1;
            iVar27 = p->nRegs;
          } while (iVar21 < iVar27);
        }
      } while( true );
    }
  }
LAB_0057a064:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

int Gia_ManAnnotateUnrolling( Gia_Man_t * p, Abc_Cex_t * pCex, int fJustMax )
{
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int RetValue, f, k, Value, Value0, Value1, iBit;
    // start storage for internal info
    assert( p->vTruths == NULL );
    p->nTtWords = Abc_BitWordNum( 2 * Gia_ManObjNum(p) );
    p->vTruths  = Vec_IntStart( (pCex->iFrame + 1) * p->nTtWords );
    // assign values to all objects (const0 and RO in frame0 are assigned 0)
    Gia_ManCleanMark0(p);
    for ( f = 0, iBit = pCex->nRegs; f <= pCex->iFrame; f++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            if ( (pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++)) )
                Gia_ManAddTwo( p, f, pObj, 1 );
        Gia_ManForEachAnd( p, pObj, k )
            if ( (pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj))) )
                Gia_ManAddTwo( p, f, pObj, 1 );
        Gia_ManForEachCo( p, pObj, k )
            if ( (pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) )
                Gia_ManAddTwo( p, f, pObj, 1 );
        if ( f == pCex->iFrame )
            break;
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            if ( (pObjRo->fMark0 = pObjRi->fMark0) )
                Gia_ManAddTwo( p, f+1, pObjRo, 1 );
    }
    assert( iBit == pCex->nBits );
    // check the output value
    RetValue = Gia_ManPo(p, pCex->iPo)->fMark0;
    if ( RetValue != 1 )
        printf( "Counter-example is invalid.\n" );
    // assign justification to nodes
    Gia_ManCleanMark0(p);
    pObj = Gia_ManPo(p, pCex->iPo);
    pObj->fMark0 = 1;
    Gia_ManAddTwo( p, pCex->iFrame, pObj, 2 );
    for ( f = pCex->iFrame; f >= 0; f-- )
    {
        // transfer to CO drivers
        Gia_ManForEachCo( p, pObj, k )
            if ( (Gia_ObjFanin0(pObj)->fMark0 = pObj->fMark0) )
            {
                pObj->fMark0 = 0;
                Gia_ManAddTwo( p, f, Gia_ObjFanin0(pObj), 2 );
            }
        // compute justification
        Gia_ManForEachAndReverse( p, pObj, k )
        {
            if ( !pObj->fMark0 ) 
                continue;
            pObj->fMark0 = 0;
            Value = (1 & Gia_ManGetTwo(p, f, pObj));
            Value0 = (1 & Gia_ManGetTwo(p, f, Gia_ObjFanin0(pObj))) ^ Gia_ObjFaninC0(pObj);
            Value1 = (1 & Gia_ManGetTwo(p, f, Gia_ObjFanin1(pObj))) ^ Gia_ObjFaninC1(pObj);
            if ( Value0 == Value1 )
            {
                assert( Value == (Value0 & Value1) );
                if ( fJustMax || Value == 1 )
                {
                    Gia_ObjFanin0(pObj)->fMark0 = Gia_ObjFanin1(pObj)->fMark0 = 1;
                    Gia_ManAddTwo( p, f, Gia_ObjFanin0(pObj), 2 );
                    Gia_ManAddTwo( p, f, Gia_ObjFanin1(pObj), 2 );
                }
                else
                {
                    Gia_ObjFanin0(pObj)->fMark0 = 1;
                    Gia_ManAddTwo( p, f, Gia_ObjFanin0(pObj), 2 );
                }
            }
            else if ( Value0 == 0 )
            {
                assert( Value == 0 );
                Gia_ObjFanin0(pObj)->fMark0 = 1;
                Gia_ManAddTwo( p, f, Gia_ObjFanin0(pObj), 2 );
            }
            else if ( Value1 == 0 )
            {
                assert( Value == 0 );
                Gia_ObjFanin1(pObj)->fMark0 = 1;
                Gia_ManAddTwo( p, f, Gia_ObjFanin1(pObj), 2 );
            }
            else assert( 0 );
        }
        if ( f == 0 )
            break;
        // transfer to RIs
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = 0;
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            if ( (pObjRi->fMark0 = pObjRo->fMark0) )
            {
                pObjRo->fMark0 = 0;
                Gia_ManAddTwo( p, f-1, pObjRi, 2 );
            }
    }
    Gia_ManCleanMark0(p);
    return RetValue;
}